

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tearing.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLint GVar5;
  GLFWmonitor *handle;
  GLFWvidmode *pGVar6;
  GLFWwindow *handle_00;
  uint *puVar7;
  int i;
  uint uVar8;
  long lVar9;
  undefined1 *puVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  long lVar14;
  float fVar15;
  double dVar16;
  int iVar17;
  undefined1 auVar18 [16];
  GLuint vertex_buffer;
  mat4x4 mvp;
  mat4x4 temp;
  double local_148;
  GLuint local_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78 [12];
  float local_48;
  undefined8 local_44;
  
  bVar13 = true;
  while( true ) {
    while( true ) {
      iVar1 = getopt(argc,argv,"fh");
      if (iVar1 != 0x66) break;
      bVar13 = false;
    }
    if (iVar1 == -1) break;
    if (iVar1 == 0x68) {
      usage();
LAB_00111079:
      exit(0);
    }
  }
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
LAB_00110c64:
    exit(1);
  }
  if (bVar13) {
    iVar1 = 0x280;
    iVar17 = 0x1e0;
    handle = (GLFWmonitor *)0x0;
  }
  else {
    handle = glfwGetPrimaryMonitor();
    pGVar6 = glfwGetVideoMode(handle);
    glfwWindowHint(0x21001,pGVar6->redBits);
    glfwWindowHint(0x21002,pGVar6->greenBits);
    glfwWindowHint(0x21003,pGVar6->blueBits);
    glfwWindowHint(0x2100f,pGVar6->refreshRate);
    iVar1 = pGVar6->width;
    iVar17 = pGVar6->height;
  }
  glfwWindowHint(0x22002,2);
  glfwWindowHint(0x22003,0);
  handle_00 = glfwCreateWindow(iVar1,iVar17,"",handle,(GLFWwindow *)0x0);
  if (handle_00 == (GLFWwindow *)0x0) {
    glfwTerminate();
    goto LAB_00110c64;
  }
  glfwMakeContextCurrent(handle_00);
  gladLoadGLLoader(glfwGetProcAddress);
  swap_interval = 0;
  glfwSwapInterval(0);
  update_window_title(handle_00);
  local_148 = glfwGetTime();
  frame_rate = 0.0;
  iVar1 = glfwExtensionSupported("WGL_EXT_swap_control_tear");
  uVar8 = 1;
  if (iVar1 == 0) {
    iVar1 = glfwExtensionSupported("GLX_EXT_swap_control_tear");
    uVar8 = (uint)(iVar1 != 0);
  }
  swap_tear = uVar8;
  glfwSetFramebufferSizeCallback(handle_00,framebuffer_size_callback);
  glfwSetKeyCallback(handle_00,key_callback);
  (*glad_glGenBuffers)(1,&local_13c);
  (*glad_glBindBuffer)(0x8892,local_13c);
  (*glad_glBufferData)(0x8892,0x20,vertices,0x88e4);
  GVar2 = (*glad_glCreateShader)(0x8b31);
  (*glad_glShaderSource)(GVar2,1,&vertex_shader_text,(GLint *)0x0);
  (*glad_glCompileShader)(GVar2);
  GVar3 = (*glad_glCreateShader)(0x8b30);
  (*glad_glShaderSource)(GVar3,1,&fragment_shader_text,(GLint *)0x0);
  (*glad_glCompileShader)(GVar3);
  GVar4 = (*glad_glCreateProgram)();
  (*glad_glAttachShader)(GVar4,GVar2);
  (*glad_glAttachShader)(GVar4,GVar3);
  (*glad_glLinkProgram)(GVar4);
  GVar5 = (*glad_glGetUniformLocation)(GVar4,"MVP");
  GVar2 = (*glad_glGetAttribLocation)(GVar4,"vPos");
  (*glad_glEnableVertexAttribArray)(GVar2);
  (*glad_glVertexAttribPointer)(GVar2,2,0x1406,'\0',8,(void *)0x0);
  iVar1 = glfwWindowShouldClose(handle_00);
  if (iVar1 == 0) {
    lVar14 = 0;
    do {
      dVar16 = glfwGetTime();
      fVar15 = cosf((float)dVar16 * 4.0);
      (*glad_glClear)(0x4000);
      local_f8._0_12_ = ZEXT812(0x3f800000);
      local_f8._12_4_ = 0;
      local_e8 = 0x3f80000000000000;
      uStack_e0 = 0;
      local_d8 = 0;
      uStack_d0 = 0xc0000000;
      local_c8 = 0x8000000080000000;
      uStack_c0 = 0x3f800000bf800000;
      lVar9 = 0;
      puVar7 = local_78;
      do {
        iVar1 = (int)lVar9;
        iVar17 = (int)((ulong)lVar9 >> 0x20);
        *puVar7 = -(uint)(iVar17 == 0 && iVar1 == 0) & 0x3f800000;
        puVar7[1] = -(uint)(iVar1 == 1 && iVar17 == 0) & 0x3f800000;
        puVar7[2] = -(uint)(iVar1 == 2 && iVar17 == 0) & 0x3f800000;
        puVar7[3] = -(uint)(iVar17 == 0 && iVar1 == 3) & 0x3f800000;
        lVar9 = lVar9 + 1;
        puVar7 = puVar7 + 4;
      } while (lVar9 != 4);
      local_48 = fVar15 * 0.75;
      local_44 = 0;
      lVar9 = 0;
      puVar7 = local_78;
      do {
        lVar11 = 0;
        puVar10 = local_f8;
        do {
          fVar15 = 0.0;
          lVar12 = 0;
          do {
            fVar15 = fVar15 + *(float *)(puVar10 + lVar12 * 4) * *(float *)((long)puVar7 + lVar12);
            lVar12 = lVar12 + 4;
          } while (lVar12 != 0x10);
          *(float *)((long)&local_b8 + lVar11 * 4 + lVar9 * 0x10) = fVar15;
          lVar11 = lVar11 + 1;
          puVar10 = puVar10 + 4;
        } while (lVar11 != 4);
        lVar9 = lVar9 + 1;
        puVar7 = puVar7 + 4;
      } while (lVar9 != 4);
      local_108 = local_88;
      uStack_100 = uStack_80;
      local_118 = local_98;
      uStack_110 = uStack_90;
      local_128 = local_a8;
      uStack_120 = uStack_a0;
      local_138 = local_b8;
      uStack_130 = uStack_b0;
      (*glad_glUseProgram)(GVar4);
      (*glad_glUniformMatrix4fv)(GVar5,1,'\0',(GLfloat *)&local_138);
      (*glad_glDrawArrays)(6,0,4);
      glfwSwapBuffers(handle_00);
      glfwPollEvents();
      lVar14 = lVar14 + 1;
      dVar16 = glfwGetTime();
      if (1.0 < dVar16 - local_148) {
        auVar18._8_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar18._0_8_ = lVar14;
        auVar18._12_4_ = 0x45300000;
        frame_rate = ((auVar18._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) /
                     (dVar16 - local_148);
        update_window_title(handle_00);
        lVar14 = 0;
        local_148 = dVar16;
      }
      iVar1 = glfwWindowShouldClose(handle_00);
    } while (iVar1 == 0);
  }
  glfwTerminate();
  goto LAB_00111079;
}

Assistant:

int main(int argc, char** argv)
{
    int ch, width, height;
    unsigned long frame_count = 0;
    double last_time, current_time;
    int fullscreen = GLFW_FALSE;
    GLFWmonitor* monitor = NULL;
    GLFWwindow* window;
    GLuint vertex_buffer, vertex_shader, fragment_shader, program;
    GLint mvp_location, vpos_location;

    while ((ch = getopt(argc, argv, "fh")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                fullscreen = GLFW_TRUE;
                break;
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (fullscreen)
    {
        const GLFWvidmode* mode;

        monitor = glfwGetPrimaryMonitor();
        mode = glfwGetVideoMode(monitor);

        glfwWindowHint(GLFW_RED_BITS, mode->redBits);
        glfwWindowHint(GLFW_GREEN_BITS, mode->greenBits);
        glfwWindowHint(GLFW_BLUE_BITS, mode->blueBits);
        glfwWindowHint(GLFW_REFRESH_RATE, mode->refreshRate);

        width = mode->width;
        height = mode->height;
    }
    else
    {
        width = 640;
        height = 480;
    }

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    window = glfwCreateWindow(width, height, "", monitor, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    set_swap_interval(window, 0);

    last_time = glfwGetTime();
    frame_rate = 0.0;
    swap_tear = (glfwExtensionSupported("WGL_EXT_swap_control_tear") ||
                 glfwExtensionSupported("GLX_EXT_swap_control_tear"));

    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);
    glfwSetKeyCallback(window, key_callback);

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    mvp_location = glGetUniformLocation(program, "MVP");
    vpos_location = glGetAttribLocation(program, "vPos");

    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vertices[0]), (void*) 0);

    while (!glfwWindowShouldClose(window))
    {
        mat4x4 m, p, mvp;
        float position = cosf((float) glfwGetTime() * 4.f) * 0.75f;

        glClear(GL_COLOR_BUFFER_BIT);

        mat4x4_ortho(p, -1.f, 1.f, -1.f, 1.f, 0.f, 1.f);
        mat4x4_translate(m, position, 0.f, 0.f);
        mat4x4_mul(mvp, p, m);

        glUseProgram(program);
        glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
        glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

        glfwSwapBuffers(window);
        glfwPollEvents();

        frame_count++;

        current_time = glfwGetTime();
        if (current_time - last_time > 1.0)
        {
            frame_rate = frame_count / (current_time - last_time);
            frame_count = 0;
            last_time = current_time;
            update_window_title(window);
        }
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}